

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

void * __thiscall cnn::SharedAllocator::malloc(SharedAllocator *this,size_t __size)

{
  void *pvVar1;
  ostream *poVar2;
  out_of_memory *this_00;
  allocator local_39;
  string local_38;
  
  pvVar1 = mmap((void *)0x0,__size,3,0x21,-1,0);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Shared memory allocation failed n=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (out_of_memory *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"Shared memory allocation failed",&local_39);
  out_of_memory::out_of_memory(this_00,&local_38);
  __cxa_throw(this_00,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void* SharedAllocator::malloc(size_t n) {
  void* ptr = mmap(NULL, n, PROT_READ|PROT_WRITE, MAP_ANON|MAP_SHARED, -1, 0);
  if (!ptr) {
    cerr << "Shared memory allocation failed n=" << n << endl;
    throw cnn::out_of_memory("Shared memory allocation failed");
  }
  return ptr;
}